

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateEnterExecutingModeIterativeAsync
               (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  IterationRequest iterate_00;
  Federate *this;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    iterate_00 = anon_unknown.dwarf_5d555::getIterationRequest(iterate);
    helics::Federate::enterExecutingModeAsync(this,iterate_00);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingModeIterativeAsync(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterExecutingModeAsync(getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}